

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer_sample.cc
# Opt level: O1

int anon_unknown.dwarf_1836::ParseArgWebVTT
              (char **argv,int *argv_index,int argc_check,metadata_files_t *metadata_files)

{
  size_t *psVar1;
  int iVar2;
  undefined4 uVar3;
  char *__s1;
  _List_node_base *p_Var4;
  int iVar5;
  _List_node_base *p_Var6;
  long lVar7;
  int local_40;
  
  lVar7 = 8;
  while( true ) {
    __s1 = *(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar7);
    iVar2 = *argv_index;
    iVar5 = strcmp(__s1,argv[iVar2]);
    if (iVar5 == 0) {
      *argv_index = iVar2 + 1;
      if (iVar2 < argc_check) {
        p_Var4 = (_List_node_base *)argv[(long)iVar2 + 1];
        uVar3 = *(undefined4 *)((long)&PTR_anon_var_dwarf_6bf_0013c7f0 + lVar7);
        p_Var6 = (_List_node_base *)operator_new(0x20);
        p_Var6[1]._M_next = p_Var4;
        *(undefined4 *)&p_Var6[1]._M_prev = uVar3;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        psVar1 = &(metadata_files->
                  super__List_base<(anonymous_namespace)::MetadataFile,_std::allocator<(anonymous_namespace)::MetadataFile>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        local_40 = 1;
      }
      else {
        printf("missing value for %s\n",__s1);
        local_40 = -1;
      }
    }
    if (iVar5 == 0) break;
    lVar7 = lVar7 + 0x10;
    if (lVar7 == 0x58) {
      return 0;
    }
  }
  return local_40;
}

Assistant:

int ParseArgWebVTT(char* argv[], int* argv_index, int argc_check,
                   metadata_files_t* metadata_files) {
  int& i = *argv_index;

  enum { kCount = 5 };
  struct Arg {
    const char* name;
    SampleMuxerMetadata::Kind kind;
  };
  const Arg args[kCount] = {
      {"-webvtt-subtitles", SampleMuxerMetadata::kSubtitles},
      {"-webvtt-captions", SampleMuxerMetadata::kCaptions},
      {"-webvtt-descriptions", SampleMuxerMetadata::kDescriptions},
      {"-webvtt-metadata", SampleMuxerMetadata::kMetadata},
      {"-webvtt-chapters", SampleMuxerMetadata::kChapters}};

  for (int idx = 0; idx < kCount; ++idx) {
    const Arg& arg = args[idx];

    if (strcmp(arg.name, argv[i]) != 0)  // no match
      continue;

    ++i;  // consume arg name here

    if (i > argc_check) {
      printf("missing value for %s\n", arg.name);
      return -1;  // error
    }

    MetadataFile f;
    f.name = argv[i];  // arg value is consumed via caller's loop idx
    f.kind = arg.kind;

    metadata_files->push_back(f);
    return 1;  // successfully parsed WebVTT arg
  }

  return 0;  // not a WebVTT arg
}